

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# age.cpp
# Opt level: O0

void duckdb::AgeFunctionStandard(DataChunk *input,ExpressionState *state,Vector *result)

{
  ClientContext *pCVar1;
  long lVar2;
  reference result_00;
  Vector *in_RDX;
  DataChunk *in_RDI;
  timestamp_t current_date;
  idx_t in_stack_ffffffffffffffa8;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffffb0;
  dtime_t local_38;
  int64_t local_30;
  date_t local_24;
  undefined8 local_20;
  Vector *local_18;
  DataChunk *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  pCVar1 = (ClientContext *)duckdb::ExpressionState::GetContext();
  lVar2 = duckdb::MetaTransaction::Get(pCVar1);
  local_30 = *(int64_t *)(lVar2 + 8);
  local_24.days = duckdb::Timestamp::GetDate((timestamp_t)local_30);
  dtime_t::dtime_t(&local_38,0);
  local_20 = duckdb::Timestamp::FromDatetime(local_24,local_38);
  result_00 = vector<duckdb::Vector,_true>::operator[]
                        (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  DataChunk::size(local_8);
  UnaryExecutor::
  ExecuteWithNulls<duckdb::timestamp_t,duckdb::interval_t,duckdb::AgeFunctionStandard(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0>
            (local_18,result_00,in_stack_ffffffffffffffa8,(timestamp_t *)&local_20);
  return;
}

Assistant:

static void AgeFunctionStandard(DataChunk &input, ExpressionState &state, Vector &result) {
	D_ASSERT(input.ColumnCount() == 1);
	//	Subtract argument from current_date (at midnight)
	//	Theoretically, this should be TZ-sensitive, but since we have to be able to handle
	//	plain TZ when ICU is not loaded, we implement this in UTC (like everything else)
	//	To get the PG behaviour, we overload these functions in ICU for TSTZ arguments.
	auto current_date = Timestamp::FromDatetime(
	    Timestamp::GetDate(MetaTransaction::Get(state.GetContext()).start_timestamp), dtime_t(0));

	UnaryExecutor::ExecuteWithNulls<timestamp_t, interval_t>(input.data[0], result, input.size(),
	                                                         [&](timestamp_t input, ValidityMask &mask, idx_t idx) {
		                                                         if (Timestamp::IsFinite(input)) {
			                                                         return Interval::GetAge(current_date, input);
		                                                         } else {
			                                                         mask.SetInvalid(idx);
			                                                         return interval_t();
		                                                         }
	                                                         });
}